

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void lua_getfenv(lua_State *L,int idx)

{
  int iVar1;
  GCObject *pGVar2;
  StkId pTVar3;
  TValue *pTVar4;
  TValue *o1;
  TValue *o2;
  TValue *i_o_1;
  TValue *i_o;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  pTVar4 = index2adr(L,idx);
  iVar1 = pTVar4->tt;
  if (iVar1 == 6) {
    pTVar3 = L->top;
    pTVar3->value = (Value)(((pTVar4->value).gc)->h).array;
    pTVar3->tt = 5;
  }
  else if (iVar1 == 7) {
    pTVar3 = L->top;
    pTVar3->value = (Value)(((pTVar4->value).gc)->h).array;
    pTVar3->tt = 5;
  }
  else if (iVar1 == 8) {
    pGVar2 = (pTVar4->value).gc;
    pTVar3 = L->top;
    pTVar3->value = (pGVar2->th).l_gt.value;
    pTVar3->tt = (pGVar2->th).l_gt.tt;
  }
  else {
    L->top->tt = 0;
  }
  L->top = L->top + 1;
  return;
}

Assistant:

static void lua_getfenv(lua_State*L,int idx){
StkId o;
o=index2adr(L,idx);
api_checkvalidindex(L,o);
switch(ttype(o)){
case 6:
sethvalue(L,L->top,clvalue(o)->c.env);
break;
case 7:
sethvalue(L,L->top,uvalue(o)->env);
break;
case 8:
setobj(L,L->top,gt(thvalue(o)));
break;
default:
setnilvalue(L->top);
break;
}
api_incr_top(L);
}